

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::changeEvent(QLineEdit *this,QEvent *ev)

{
  bool bVar1;
  char16_t ch;
  Type TVar2;
  int delay;
  QLineEditPrivate *pQVar3;
  QPalette *pQVar4;
  ulong uVar5;
  QStyle *pQVar6;
  reference pSVar7;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  SideWidgetEntry *e;
  SideWidgetEntryList *__range2;
  QLineEditPrivate *d;
  iterator __end2;
  iterator __begin2;
  QStyleOptionFrame opt;
  undefined6 in_stack_ffffffffffffff28;
  QChar in_stack_ffffffffffffff2e;
  QWidgetLineControl *in_stack_ffffffffffffff30;
  QWidgetLineControl *in_stack_ffffffffffffff38;
  QLineEditPrivate *in_stack_ffffffffffffff40;
  QIcon local_78;
  SideWidgetEntry *local_70;
  __normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
  local_68;
  QChar local_5a;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QLineEdit *)0x5ca955);
  TVar2 = QEvent::type(in_RSI);
  switch(TVar2) {
  case LayoutDirectionChange:
    pQVar3 = (QLineEditPrivate *)&pQVar3->trailingSideWidgets;
    local_68._M_current = (SideWidgetEntry *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._M_current =
         (SideWidgetEntry *)
         std::
         vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ::begin((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                  *)in_stack_ffffffffffffff30);
    local_70 = (SideWidgetEntry *)&DAT_aaaaaaaaaaaaaaaa;
    local_70 = (SideWidgetEntry *)
               std::
               vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
               ::end((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                      *)in_stack_ffffffffffffff30);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                               *)CONCAT26(in_stack_ffffffffffffff2e.ucs,in_stack_ffffffffffffff28)),
          bVar1) {
      pSVar7 = __gnu_cxx::
               __normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
               ::operator*(&local_68);
      if ((pSVar7->flags & 4U) != 0) {
        in_stack_ffffffffffffff30 = (QWidgetLineControl *)pSVar7->widget;
        QLineEditPrivate::clearButtonIcon(in_stack_ffffffffffffff40);
        QAbstractButton::setIcon
                  ((QAbstractButton *)in_stack_ffffffffffffff40,(QIcon *)in_stack_ffffffffffffff38);
        QIcon::~QIcon(&local_78);
      }
      __gnu_cxx::
      __normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
      ::operator++(&local_68);
    }
    QLineEditPrivate::positionSideWidgets(pQVar3);
    break;
  default:
    break;
  case FontChange:
    QWidget::font(in_RDI);
    QWidgetLineControl::setFont
              (in_stack_ffffffffffffff30,
               (QFont *)CONCAT26(in_stack_ffffffffffffff2e.ucs,in_stack_ffffffffffffff28));
    break;
  case ActivationChange:
    pQVar4 = QWidget::palette((QWidget *)in_stack_ffffffffffffff30);
    uVar5 = QPalette::isEqual((ColorGroup)pQVar4,Active);
    if ((uVar5 & 1) == 0) {
      QWidget::update((QWidget *)CONCAT26(in_stack_ffffffffffffff2e.ucs,in_stack_ffffffffffffff28));
    }
    break;
  case StyleChange:
    memset(local_58,0xaa,0x50);
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x5caa0a);
    (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,local_58);
    in_stack_ffffffffffffff38 = pQVar3->control;
    pQVar6 = QWidget::style((QWidget *)
                            CONCAT26(in_stack_ffffffffffffff2e.ucs,in_stack_ffffffffffffff28));
    ch = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x23,local_58,in_RDI,0);
    QChar::QChar<char16_t,_true>(&local_5a,ch);
    QWidgetLineControl::setPasswordCharacter
              ((QWidgetLineControl *)0x5caa78,in_stack_ffffffffffffff2e);
    in_stack_ffffffffffffff40 = (QLineEditPrivate *)pQVar3->control;
    pQVar6 = QWidget::style((QWidget *)
                            CONCAT26(in_stack_ffffffffffffff2e.ucs,in_stack_ffffffffffffff28));
    delay = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x67,local_58,in_RDI,0);
    QWidgetLineControl::setPasswordMaskDelay((QWidgetLineControl *)in_stack_ffffffffffffff40,delay);
    QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x5caacd);
    QWidget::update((QWidget *)CONCAT26(in_stack_ffffffffffffff2e.ucs,in_stack_ffffffffffffff28));
  }
  QWidget::changeEvent((QWidget *)in_stack_ffffffffffffff40,(QEvent *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::changeEvent(QEvent *ev)
{
    Q_D(QLineEdit);
    switch(ev->type())
    {
    case QEvent::ActivationChange:
        if (!palette().isEqual(QPalette::Active, QPalette::Inactive))
            update();
        break;
    case QEvent::FontChange:
        d->control->setFont(font());
        break;
    case QEvent::StyleChange:
        {
            QStyleOptionFrame opt;
            initStyleOption(&opt);
            d->control->setPasswordCharacter(char16_t(style()->styleHint(QStyle::SH_LineEdit_PasswordCharacter, &opt, this)));
            d->control->setPasswordMaskDelay(style()->styleHint(QStyle::SH_LineEdit_PasswordMaskDelay, &opt, this));
        }
        update();
        break;
    case QEvent::LayoutDirectionChange:
#if QT_CONFIG(toolbutton)
        for (const auto &e : d->trailingSideWidgets) { // Refresh icon to show arrow in right direction.
            if (e.flags & QLineEditPrivate::SideWidgetClearButton)
                static_cast<QLineEditIconButton *>(e.widget)->setIcon(d->clearButtonIcon());
        }
#endif
        d->positionSideWidgets();
        break;
    default:
        break;
    }
    QWidget::changeEvent(ev);
}